

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

address_range_iterator __thiscall
llvm::DWARFVerifier::DieRangeInfo::insert(DieRangeInfo *this,DWARFAddressRange *R)

{
  DWARFAddressRange *pDVar1;
  DWARFAddressRange *pDVar2;
  bool bVar3;
  __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  __position;
  
  pDVar1 = (this->Ranges).
           super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->Ranges).
           super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<llvm::DWARFAddressRange*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>,llvm::DWARFAddressRange,__gnu_cxx::__ops::_Iter_less_val>
                         (pDVar1,pDVar2,R);
  if (__position._M_current != pDVar2) {
    bVar3 = DWARFAddressRange::intersects(__position._M_current,R);
    if (bVar3) {
      return (address_range_iterator)__position._M_current;
    }
    if (__position._M_current != pDVar1) {
      bVar3 = DWARFAddressRange::intersects(__position._M_current + -1,R);
      if (bVar3) {
        return (address_range_iterator)(__position._M_current + -1);
      }
    }
  }
  std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::insert
            (&this->Ranges,(const_iterator)__position._M_current,R);
  return (address_range_iterator)
         (this->Ranges).
         super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

DWARFVerifier::DieRangeInfo::address_range_iterator
DWARFVerifier::DieRangeInfo::insert(const DWARFAddressRange &R) {
  auto Begin = Ranges.begin();
  auto End = Ranges.end();
  auto Pos = std::lower_bound(Begin, End, R);

  if (Pos != End) {
    if (Pos->intersects(R))
      return std::move(Pos);
    if (Pos != Begin) {
      auto Iter = Pos - 1;
      if (Iter->intersects(R))
        return std::move(Iter);
    }
  }

  Ranges.insert(Pos, R);
  return Ranges.end();
}